

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenization_args.h
# Opt level: O0

Options * build_tokenization_options(ParseResult *args)

{
  Mode MVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool *pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  OptionValue *this_00;
  OptionValue *option;
  size_type sVar4;
  ulong uVar5;
  ParseResult *in_RSI;
  Options *in_RDI;
  Options *options;
  Options *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa48;
  ParseResult *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  allocator<char> *__s;
  OptionValue *in_stack_fffffffffffffa60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [39];
  undefined1 local_2a1 [40];
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [39];
  undefined1 local_11;
  ParseResult *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  onmt::Tokenizer::Options::Options(in_stack_fffffffffffffa20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar2 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffa60);
  MVar1 = onmt::Tokenizer::str_to_mode((string *)pbVar2);
  in_RDI->mode = MVar1;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar2 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffa60);
  std::__cxx11::string::operator=((string *)&in_RDI->lang,(string *)pbVar2);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->no_substitution = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->with_separators = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->allow_isolated_marks = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->case_feature = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->case_markup = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->soft_case_regions = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->joiner_annotate = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->joiner_new = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar2 = cxxopts::OptionValue::as<std::__cxx11::string>(in_stack_fffffffffffffa60);
  std::__cxx11::string::operator=((string *)&in_RDI->joiner,(string *)pbVar2);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->spacer_annotate = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->spacer_new = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->preserve_placeholders = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->preserve_segmented_tokens =
       (bool)(*(bool *)&(this->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start & 1);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_279);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_2a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->support_prior_joiners = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string((string *)(local_2a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->segment_case = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
             (allocator<char> *)in_stack_fffffffffffffa50);
  cxxopts::ParseResult::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  this_00 = (OptionValue *)cxxopts::OptionValue::as<bool>(in_stack_fffffffffffffa60);
  in_RDI->segment_numbers = (bool)((byte)*(_Alloc_hider *)&this_00->m_long_name & 1);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  __s = &local_319;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,(allocator<char> *)local_10);
  option = cxxopts::ParseResult::operator[](local_10,in_stack_fffffffffffffa48);
  pbVar3 = cxxopts::OptionValue::as<bool>(this_00);
  in_RDI->segment_alphabet_change = (bool)(*pbVar3 & 1);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,(allocator<char> *)local_10);
  cxxopts::ParseResult::operator[](local_10,(string *)option);
  cxxopts::OptionValue::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this,__x);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->segment_alphabet);
  if (sVar4 == 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&in_RDI->segment_alphabet,0);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x1273b3);
    }
  }
  return in_RDI;
}

Assistant:

inline onmt::Tokenizer::Options build_tokenization_options(const cxxopts::ParseResult& args)
{
  onmt::Tokenizer::Options options;
  options.mode = onmt::Tokenizer::str_to_mode(args["mode"].as<std::string>());
  options.lang = args["lang"].as<std::string>();
  options.no_substitution = args["no_substitution"].as<bool>();
  options.with_separators = args["with_separators"].as<bool>();
  options.allow_isolated_marks = args["allow_isolated_marks"].as<bool>();
  options.case_feature = args["case_feature"].as<bool>();
  options.case_markup = args["case_markup"].as<bool>();
  options.soft_case_regions = args["soft_case_regions"].as<bool>();
  options.joiner_annotate = args["joiner_annotate"].as<bool>();
  options.joiner_new = args["joiner_new"].as<bool>();
  options.joiner = args["joiner"].as<std::string>();
  options.spacer_annotate = args["spacer_annotate"].as<bool>();
  options.spacer_new = args["spacer_new"].as<bool>();
  options.preserve_placeholders = args["preserve_placeholders"].as<bool>();
  options.preserve_segmented_tokens = args["preserve_segmented_tokens"].as<bool>();
  options.support_prior_joiners = args["support_prior_joiners"].as<bool>();
  options.segment_case = args["segment_case"].as<bool>();
  options.segment_numbers = args["segment_numbers"].as<bool>();
  options.segment_alphabet_change = args["segment_alphabet_change"].as<bool>();
  options.segment_alphabet = args["segment_alphabet"].as<std::vector<std::string>>();
  if (options.segment_alphabet.size() == 1 && options.segment_alphabet[0].empty())
    options.segment_alphabet.clear();
  return options;
}